

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::ES>
           *this,TestShaderType tested_shader_type)

{
  _Base_ptr *__rhs;
  iterator iVar1;
  TestError *pTVar2;
  long lVar3;
  _Base_ptr *__rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string base_variable_string;
  
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x3c) {
      return;
    }
    iVar1 = std::
            _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
            ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                    *)supported_variable_types_map,(key_type *)(opaque_var_types + lVar3));
    if (iVar1._M_node == (_Base_ptr)(supported_variable_types_map + 8)) break;
    __rhs = &iVar1._M_node[2]._M_parent;
    std::operator+(&local_130,"uniform ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(&local_110,&local_130," ");
    __rhs_00 = &iVar1._M_node[1]._M_parent;
    std::operator+(&local_170,&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
    std::operator+(&local_150,&local_170," my_sampler1;\n");
    std::operator+(&local_f0,&local_150,"uniform ");
    std::operator+(&local_d0,&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(&local_b0,&local_d0," ");
    std::operator+(&local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
    std::operator+(&local_70,&local_90," my_sampler2;\n");
    std::operator+(&local_210,&local_70,"uniform ");
    std::operator+(&local_1f0,&local_210,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(&local_290,&local_1f0," ");
    std::operator+(&local_270,&local_290,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
    std::operator+(&local_250,&local_270," my_sampler3;\n");
    std::operator+(&local_230,&local_250,"uniform ");
    std::operator+(&local_1d0,&local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(&local_1b0,&local_1d0," ");
    std::operator+(&shader_source,&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
    std::operator+(&base_variable_string,&shader_source," my_sampler4;\n\n");
    std::__cxx11::string::~string((string *)&shader_source);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::operator+(&shader_source,&base_variable_string,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   shader_start_abi_cxx11_);
    std::operator+(&local_210,"    const ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
    std::operator+(&local_1f0,&local_210,"[2][2] x = ");
    std::operator+(&local_290,&local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
    std::operator+(&local_270,&local_290,"[2][2](");
    std::operator+(&local_250,&local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
    std::operator+(&local_230,&local_250,"[2](my_sampler1, my_sampler2), ");
    std::operator+(&local_1d0,&local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
    std::operator+(&local_1b0,&local_1d0,"[2](my_sampler3, my_sampler4));\n\n");
    std::__cxx11::string::append((string *)&shader_source);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x887);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    switch(tested_shader_type) {
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&shader_source);
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
    case GEOMETRY_SHADER_TYPE:
      std::__cxx11::string::append((string *)&shader_source);
    }
    std::__cxx11::string::append((string *)&shader_source);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)tested_shader_type,&shader_source);
    std::__cxx11::string::~string((string *)&shader_source);
    std::__cxx11::string::~string((string *)&base_variable_string);
    lVar3 = lVar3 + 4;
  }
  pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar2,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x88e);
  __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ConstructorsAndUnsizedDeclInvalidConstructors1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = sizeof(opaque_var_types) / sizeof(opaque_var_types[0]);

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(opaque_var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string base_variable_string =
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler1;\n" +
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler2;\n" +
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler3;\n" +
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler4;\n\n";

			std::string shader_source = base_variable_string + shader_start;
			shader_source += "    const " + var_iterator->second.type + "[2][2] x = " + var_iterator->second.type +
							 "[2][2](" + var_iterator->second.type + "[2](my_sampler1, my_sampler2), " +
							 var_iterator->second.type + "[2](my_sampler3, my_sampler4));\n\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}